

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_14(QPDF *pdf,char *arg2)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  size_type sVar5;
  logic_error *this;
  reference pvVar6;
  long lVar7;
  ostream *poVar8;
  longlong lVar9;
  void *pvVar10;
  size_type sVar11;
  char *pcVar12;
  FILE *__s;
  size_t __size;
  bool bVar13;
  char *local_5c8;
  FILE *f;
  string local_418 [8];
  string filename;
  Buffer *b;
  QPDFWriter w;
  int local_3e0;
  allocator<char> local_3d9;
  int i;
  byte local_3b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_390 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  dict_items;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> array_elements;
  string local_338 [32];
  undefined8 local_318;
  QPDFObjectHandle local_310;
  allocator<char> local_2f9;
  string local_2f8 [32];
  QPDFObjectHandle local_2d8;
  QPDFObjectHandle local_2c8;
  string local_2b8 [36];
  undefined8 local_294;
  QPDFObjGen local_28c;
  allocator<char> local_281;
  string local_280 [32];
  QPDFObjectHandle local_260;
  QPDFObjectHandle local_250;
  QPDFObjectHandle *local_240;
  logic_error *anon_var_0;
  QPDFObjectHandle *local_220;
  QPDFObjectHandle local_218;
  allocator<char> local_201;
  string local_200 [32];
  undefined1 local_1e0 [8];
  QPDFObjectHandle new_dict;
  string local_1c8 [32];
  undefined1 local_1a8 [8];
  QPDFObjectHandle qarray;
  string local_190 [32];
  undefined1 local_170 [8];
  QPDFObjectHandle qdict;
  QPDFObjectHandle trailer;
  string local_148 [32];
  QPDFObjectHandle local_128;
  allocator<char> local_111;
  string local_110 [32];
  QPDFObjectHandle local_f0;
  undefined8 local_dc;
  QPDFObjGen local_d4;
  allocator<char> local_c9;
  string local_c8 [32];
  QPDFObjectHandle local_a8;
  allocator<char> local_91;
  string local_90 [32];
  QPDFObjectHandle local_70;
  undefined1 local_60 [8];
  value_type orig_page3;
  value_type orig_page2;
  undefined1 local_30 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  char *arg2_local;
  QPDF *pdf_local;
  
  pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)arg2;
  __x = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_30,__x);
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_30);
  if (sVar5 != 4) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"test 14 not called 4-page file");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_30,1);
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &orig_page3.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pvVar6);
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_30,2);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_60,pvVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"/OrigPage",&local_91);
  QPDFObjectHandle::getKey((string *)&local_70);
  lVar7 = QPDFObjectHandle::getIntValue();
  if (lVar7 != 2) {
    __assert_fail("orig_page2.getKey(\"/OrigPage\").getIntValue() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,600,"void test_14(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"/OrigPage",&local_c9);
  QPDFObjectHandle::getKey((string *)&local_a8);
  lVar7 = QPDFObjectHandle::getIntValue();
  if (lVar7 != 3) {
    __assert_fail("orig_page3.getKey(\"/OrigPage\").getIntValue() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x259,"void test_14(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_d4 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  local_dc = QPDFObjectHandle::getObjGen();
  QPDF::swapObjects((QPDFObjGen)pdf,local_d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"/OrigPage",&local_111);
  QPDFObjectHandle::getKey((string *)&local_f0);
  lVar7 = QPDFObjectHandle::getIntValue();
  if (lVar7 != 3) {
    __assert_fail("orig_page2.getKey(\"/OrigPage\").getIntValue() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x25b,"void test_14(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"/OrigPage",
             (allocator<char> *)
             ((long)&trailer.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)&local_128);
  lVar7 = QPDFObjectHandle::getIntValue();
  if (lVar7 != 2) {
    __assert_fail("orig_page3.getKey(\"/OrigPage\").getIntValue() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x25c,"void test_14(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&trailer.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_190,"/QDict",
             (allocator<char> *)
             ((long)&qarray.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&qarray.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c8,"/QArray",
             (allocator<char> *)
             ((long)&new_dict.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_1a8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&new_dict.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::isDictionary();
  QPDFObjectHandle::newDictionary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"/NewDict",&local_201);
  QPDFObjectHandle::newInteger((longlong)&local_218);
  QPDFObjectHandle::replaceKey((string *)local_1e0,(QPDFObjectHandle *)local_200);
  QPDFObjectHandle::~QPDFObjectHandle(&local_218);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  local_220 = (QPDFObjectHandle *)QPDFObjectHandle::getObjGen();
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&anon_var_0,(QPDFObjectHandle *)local_170);
  QPDF::replaceObject((QPDFObjGen)pdf,local_220);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&anon_var_0);
  local_240 = (QPDFObjectHandle *)QPDFObjectHandle::getObjGen();
  QPDFObjectHandle::QPDFObjectHandle(&local_250,(QPDFObjectHandle *)local_1e0);
  QPDF::replaceObject((QPDFObjGen)pdf,local_240);
  QPDFObjectHandle::~QPDFObjectHandle(&local_250);
  poVar8 = std::operator<<((ostream *)&std::cout,"old dict: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_280,"/NewDict",&local_281);
  QPDFObjectHandle::getKey((string *)&local_260);
  lVar9 = QPDFObjectHandle::getIntValue();
  pvVar10 = (void *)std::ostream::operator<<(poVar8,lVar9);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::~QPDFObjectHandle(&local_260);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  local_28c = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  local_294 = QPDFObjectHandle::getObjGen();
  QPDF::swapObjects((QPDFObjGen)pdf,local_28c);
  poVar8 = std::operator<<((ostream *)&std::cout,"swapped array: ");
  QPDFObjectHandle::getArrayItem((int)&local_2c8);
  QPDFObjectHandle::getName_abi_cxx11_();
  poVar8 = std::operator<<(poVar8,local_2b8);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_2b8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_2c8);
  poVar8 = std::operator<<((ostream *)&std::cout,"new dict: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"/NewDict",&local_2f9);
  QPDFObjectHandle::getKey((string *)&local_2d8);
  lVar9 = QPDFObjectHandle::getIntValue();
  pvVar10 = (void *)std::ostream::operator<<(poVar8,lVar9);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::~QPDFObjectHandle(&local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  local_318 = QPDFObjectHandle::getObjGen();
  QPDF::getObjectByObjGen((QPDFObjGen)&local_310);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_170,&local_310);
  QPDFObjectHandle::~QPDFObjectHandle(&local_310);
  poVar8 = std::operator<<((ostream *)&std::cout,"swapped array: ");
  QPDFObjectHandle::getArrayItem((int)&array_elements + 0x10);
  QPDFObjectHandle::getName_abi_cxx11_();
  poVar8 = std::operator<<(poVar8,local_338);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_338);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &array_elements.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  QPDFObjectHandle::getArrayAsVector();
  QPDFObjectHandle::getDictAsMap_abi_cxx11_();
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     &dict_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_3b1 = 0;
  bVar2 = false;
  bVar1 = false;
  bVar13 = false;
  if (sVar5 == 1) {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &dict_items._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
    QPDFObjectHandle::getName_abi_cxx11_();
    local_3b1 = 1;
    bVar4 = std::operator==(&local_3b0,"/Array");
    bVar13 = false;
    if (bVar4) {
      sVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                       *)local_390);
      bVar13 = false;
      if (sVar11 == 1) {
        std::allocator<char>::allocator();
        bVar2 = true;
        std::__cxx11::string::string<std::allocator<char>>((string *)&i,"/NewDict",&local_3d9);
        bVar1 = true;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      *)local_390,(key_type *)&i);
        lVar7 = QPDFObjectHandle::getIntValue();
        bVar13 = lVar7 == 2;
      }
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&i);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_3d9);
  }
  if ((local_3b1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_3b0);
  }
  if (bVar13) {
    poVar8 = std::operator<<((ostream *)&std::cout,"array and dictionary contents are correct");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  for (local_3e0 = 0; local_3e0 < 2; local_3e0 = local_3e0 + 1) {
    QPDFWriter::QPDFWriter((QPDFWriter *)&b,pdf);
    QPDFWriter::setOutputMemory();
    QPDFWriter::setStaticID(SUB81(&b,0));
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&b);
    QPDFWriter::write();
    filename.field_2._8_8_ = QPDFWriter::getBuffer();
    if (local_3e0 == 0) {
      local_5c8 = "a.pdf";
    }
    else {
      local_5c8 = "b.pdf";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_418,local_5c8,(allocator<char> *)((long)&f + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&f + 7));
    pcVar12 = (char *)std::__cxx11::string::c_str();
    __s = (FILE *)QUtil::safe_fopen(pcVar12,"wb");
    pvVar10 = (void *)Buffer::getBuffer();
    __size = Buffer::getSize();
    fwrite(pvVar10,__size,1,__s);
    fclose(__s);
    uVar3 = filename.field_2._8_8_;
    if (filename.field_2._8_8_ != 0) {
      Buffer::~Buffer((Buffer *)filename.field_2._8_8_);
      operator_delete((void *)uVar3,8);
    }
    std::__cxx11::string::~string(local_418);
    QPDFWriter::~QPDFWriter((QPDFWriter *)&b);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
          *)local_390);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             &dict_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1e0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1a8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_170);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &qdict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_60);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &orig_page3.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_30);
  return;
}

Assistant:

static void
test_14(QPDF& pdf, char const* arg2)
{
    // Exercise swap and replace.  This test case is designed for
    // a specific file.
    std::vector<QPDFObjectHandle> pages = pdf.getAllPages();
    if (pages.size() != 4) {
        throw std::logic_error("test 14 not called 4-page file");
    }
    // Swap pages 2 and 3
    auto orig_page2 = pages.at(1);
    auto orig_page3 = pages.at(2);
    assert(orig_page2.getKey("/OrigPage").getIntValue() == 2);
    assert(orig_page3.getKey("/OrigPage").getIntValue() == 3);
    pdf.swapObjects(orig_page2.getObjGen(), orig_page3.getObjGen());
    assert(orig_page2.getKey("/OrigPage").getIntValue() == 3);
    assert(orig_page3.getKey("/OrigPage").getIntValue() == 2);
    // Replace object and swap objects
    QPDFObjectHandle trailer = pdf.getTrailer();
    QPDFObjectHandle qdict = trailer.getKey("/QDict");
    QPDFObjectHandle qarray = trailer.getKey("/QArray");
    // Force qdict but not qarray to resolve
    qdict.isDictionary();
    QPDFObjectHandle new_dict = QPDFObjectHandle::newDictionary();
    new_dict.replaceKey("/NewDict", QPDFObjectHandle::newInteger(2));
    try {
        // Do it wrong first...
        pdf.replaceObject(qdict.getObjGen(), qdict);
    } catch (std::logic_error const&) {
        std::cout << "caught logic error as expected" << std::endl;
    }
    pdf.replaceObject(qdict.getObjGen(), new_dict);
    // Now qdict points to the new dictionary
    std::cout << "old dict: " << qdict.getKey("/NewDict").getIntValue() << std::endl;
    // Swap dict and array
    pdf.swapObjects(qdict.getObjGen(), qarray.getObjGen());
    // Now qarray will resolve to new object and qdict resolves to
    // the array
    std::cout << "swapped array: " << qdict.getArrayItem(0).getName() << std::endl;
    std::cout << "new dict: " << qarray.getKey("/NewDict").getIntValue() << std::endl;
    // Reread qdict, still pointing to an array
    qdict = pdf.getObjectByObjGen(qdict.getObjGen());
    std::cout << "swapped array: " << qdict.getArrayItem(0).getName() << std::endl;

    // Exercise getAsMap and getAsArray
    std::vector<QPDFObjectHandle> array_elements = qdict.getArrayAsVector();
    std::map<std::string, QPDFObjectHandle> dict_items = qarray.getDictAsMap();
    if ((array_elements.size() == 1) && (array_elements.at(0).getName() == "/Array") &&
        (dict_items.size() == 1) && (dict_items["/NewDict"].getIntValue() == 2)) {
        std::cout << "array and dictionary contents are correct" << std::endl;
    }

    // Exercise writing to memory buffer
    for (int i = 0; i < 2; ++i) {
        QPDFWriter w(pdf);
        w.setOutputMemory();
        // Exercise setOutputMemory with and without static ID
        w.setStaticID(i == 0);
        w.setStreamDataMode(qpdf_s_preserve);
        w.write();
        Buffer* b = w.getBuffer();
        std::string const filename = (i == 0 ? "a.pdf" : "b.pdf");
        FILE* f = QUtil::safe_fopen(filename.c_str(), "wb");
        fwrite(b->getBuffer(), b->getSize(), 1, f);
        fclose(f);
        delete b;
    }
}